

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

ExceptionOr<kj::Rc<kj::Refcounted>_> * __thiscall
kj::_::ExceptionOr<kj::Rc<kj::Refcounted>_>::operator=
          (ExceptionOr<kj::Rc<kj::Refcounted>_> *this,ExceptionOr<kj::Rc<kj::Refcounted>_> *param_1)

{
  ExceptionOr<kj::Rc<kj::Refcounted>_> *param_1_local;
  ExceptionOr<kj::Rc<kj::Refcounted>_> *this_local;
  
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  Maybe<kj::Rc<kj::Refcounted>_>::operator=(&this->value,&param_1->value);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;